

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::ReplaceCharacters(string *s,char *remove,char replacewith)

{
  pointer pcVar1;
  char *pcVar2;
  pointer __s;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  __s = pcVar1;
  while( true ) {
    pcVar2 = strpbrk(__s,remove);
    if (pcVar2 == (char *)0x0) break;
    pcVar2[(long)(s->_M_dataplus)._M_p - (long)pcVar1] = replacewith;
    __s = pcVar2 + 1;
  }
  return;
}

Assistant:

void ReplaceCharacters(string *s, const char *remove, char replacewith) {
  const char *str_start = s->c_str();
  const char *str = str_start;
  for (str = strpbrk(str, remove);
       str != nullptr;
       str = strpbrk(str + 1, remove)) {
    (*s)[str - str_start] = replacewith;
  }
}